

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

double free_format_parser::getWallTime(void)

{
  rep rVar1;
  double wall_time;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffd8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  rep_conflict local_18;
  duration<double,_std::ratio<1L,_1L>_> local_10 [2];
  
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_18 = (rep_conflict)
             std::chrono::
             time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             ::time_since_epoch(&local_20);
  local_10[0].__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      (in_stack_ffffffffffffffd8);
  rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_10);
  return rVar1;
}

Assistant:

double getWallTime() {
  using namespace std::chrono;
  const double wall_time = kNoClockCalls
                               ? 0
                               : duration_cast<duration<double> >(
                                     wall_clock::now().time_since_epoch())
                                     .count();
  return wall_time;
}